

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O1

bool __thiscall
cmBuildCommand::TwoArgsSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *name;
  bool bVar1;
  char *pcVar2;
  cmGlobalGenerator *this_00;
  ulong uVar3;
  string configType;
  string makecommand;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (uVar3 < 0x21) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"called with less than two arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_001a6e49;
  }
  else {
    pcVar2 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",&local_b0);
    if (!bVar1 || (char *)local_b0._M_string_length == (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x4e667a);
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    bVar1 = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&local_50,this_00,&local_90,&local_b0,&local_70,bVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (pcVar2 == (char *)0x0) {
      cmMakefile::AddCacheDefinition
                ((this->super_cmCommand).Makefile,name,local_50._M_dataplus._M_p,
                 "Command used to build entire project from the command line.",STRING,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_001a6e49;
  }
  operator_delete(local_b0._M_dataplus._M_p,
                  CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                           local_b0.field_2._M_local_buf[0]) + 1);
LAB_001a6e49:
  return 0x20 < uVar3;
}

Assistant:

bool cmBuildCommand::TwoArgsSignature(std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("called with less than two arguments");
    return false;
  }

  std::string const& define = args[0];
  const char* cacheValue = this->Makefile->GetDefinition(define);

  std::string configType;
  if (!cmSystemTools::GetEnv("CMAKE_CONFIG_TYPE", configType) ||
      configType.empty()) {
    configType = "Release";
  }

  std::string makecommand =
    this->Makefile->GetGlobalGenerator()->GenerateCMakeBuildCommand(
      "", configType, "", this->Makefile->IgnoreErrorsCMP0061());

  if (cacheValue) {
    return true;
  }
  this->Makefile->AddCacheDefinition(define, makecommand.c_str(),
                                     "Command used to build entire project "
                                     "from the command line.",
                                     cmStateEnums::STRING);
  return true;
}